

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util.cc
# Opt level: O2

Status __thiscall
google::protobuf::util::anon_unknown_0::DescriptorPoolTypeResolver::ParseTypeUrl
          (DescriptorPoolTypeResolver *this,string_view type_url,string *type_name)

{
  bool bVar1;
  string *psVar2;
  size_t sVar3;
  string *in_R8;
  AlphaNum *in_R9;
  string_view expected;
  string_view expected_00;
  string_view message;
  basic_string_view<char,_std::char_traits<char>_> local_118;
  string local_108;
  AlphaNum local_e8;
  string_view local_b8 [3];
  AlphaNum local_88;
  AlphaNum local_58;
  
  sVar3 = type_url._M_len;
  expected._M_str = (char *)type_name;
  expected._M_len = *(size_t *)(sVar3 + 8);
  psVar2 = type_name;
  local_118._M_len = (size_t)type_url._M_str;
  local_118._M_str = (char *)type_name;
  bVar1 = absl::lts_20250127::ConsumePrefix
                    ((lts_20250127 *)&local_118,*(Nonnull<absl::string_view_*> *)(sVar3 + 0x10),
                     expected);
  if ((bVar1) &&
     (expected_00._M_str = (char *)psVar2, expected_00._M_len = (size_t)"/",
     bVar1 = absl::lts_20250127::ConsumePrefix
                       ((lts_20250127 *)&local_118,(Nonnull<absl::string_view_*>)0x1,expected_00),
     bVar1)) {
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)local_b8,&local_118,(allocator<char> *)&local_e8);
    std::__cxx11::string::operator=(in_R8,(string *)local_b8);
    std::__cxx11::string::~string((string *)local_b8);
    (this->super_TypeResolver)._vptr_TypeResolver = (_func_int **)0x1;
    return (Status)(uintptr_t)this;
  }
  local_b8[0] = absl::lts_20250127::NullSafeStringView
                          ("Invalid type URL, type URLs must be of the form \'");
  local_e8.piece_._M_str = *(char **)(sVar3 + 8);
  local_e8.piece_._M_len = *(size_t *)(sVar3 + 0x10);
  local_58.piece_ = absl::lts_20250127::NullSafeStringView("/<typename>\', got: ");
  local_88.piece_._M_len = (size_t)type_url._M_str;
  local_88.piece_._M_str = (char *)type_name;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_108,(lts_20250127 *)local_b8,&local_e8,&local_58,&local_88,in_R9);
  message._M_str = (char *)local_108._M_string_length;
  message._M_len = (size_t)this;
  absl::lts_20250127::InvalidArgumentError(message);
  std::__cxx11::string::~string((string *)&local_108);
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status ParseTypeUrl(absl::string_view type_url,
                            std::string* type_name) {
    absl::string_view stripped = type_url;
    if (!absl::ConsumePrefix(&stripped, url_prefix_) ||
        !absl::ConsumePrefix(&stripped, "/")) {
      return absl::InvalidArgumentError(
          absl::StrCat("Invalid type URL, type URLs must be of the form '",
                       url_prefix_, "/<typename>', got: ", type_url));
    }
    *type_name = std::string(stripped);
    return absl::Status();
  }